

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 ExtractNonSpaceToken(char **pzIn,char *zEnd,SyString *pOut)

{
  char cVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  pcVar5 = *pzIn;
  if (pcVar5 < zEnd) {
    uVar6 = (ulong)pcVar5 & 0xffffffff;
    do {
      cVar1 = *pcVar5;
      pcVar2 = pcVar5;
      pcVar4 = pcVar5;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      {
        while ((pcVar2 < zEnd &&
               ((cVar1 = *pcVar2, pcVar4 = pcVar2, (ulong)(long)cVar1 < 0xffffffffffffffc0 &&
                (ppuVar3 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0))))) {
          pcVar2 = pcVar2 + 1;
          pcVar4 = zEnd;
        }
        pOut->zString = pcVar5;
        pOut->nByte = (int)pcVar4 - (int)uVar6;
        *pzIn = pcVar4;
        return 0;
      }
      pcVar5 = pcVar5 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (pcVar5 != zEnd);
  }
  return -0x12;
}

Assistant:

static sxi32 ExtractNonSpaceToken(const char **pzIn, const char *zEnd, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading white spaces */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && !SyisSpace(zIn[0]) ){
		zIn++;
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Synchronize pointers */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}